

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scenegraph.cpp
# Opt level: O3

Ref<embree::SceneGraph::Node> __thiscall
embree::SceneGraph::load(SceneGraph *this,FileName *filename,bool singleObject)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  undefined1 *puVar2;
  int iVar3;
  runtime_error *this_00;
  bool bVar4;
  string local_b8;
  undefined1 *local_98;
  size_t local_90;
  undefined1 local_88 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_68;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  FileName::ext_abi_cxx11_(&local_b8,filename);
  toLowerCase((string *)&local_78.field_1,&local_b8);
  local_98 = local_88;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"obj","");
  puVar2 = local_98;
  if (local_78._8_8_ == local_90) {
    if (local_78._8_8_ == 0) {
      bVar4 = true;
    }
    else {
      iVar3 = bcmp((void *)local_78._0_8_,local_98,local_78._8_8_);
      bVar4 = iVar3 == 0;
    }
  }
  else {
    bVar4 = false;
  }
  if (puVar2 != local_88) {
    operator_delete(puVar2);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._0_8_ != &local_68) {
    operator_delete((void *)local_78._0_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p);
  }
  if (bVar4) {
    loadOBJ((embree *)this,filename,false,singleObject);
  }
  else {
    FileName::ext_abi_cxx11_(&local_b8,filename);
    toLowerCase((string *)&local_78.field_1,&local_b8);
    paVar1 = &local_b8.field_2;
    local_98 = local_88;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"ply","");
    puVar2 = local_98;
    if (local_78._8_8_ == local_90) {
      if (local_78._8_8_ == 0) {
        bVar4 = true;
      }
      else {
        iVar3 = bcmp((void *)local_78._0_8_,local_98,local_78._8_8_);
        bVar4 = iVar3 == 0;
      }
    }
    else {
      bVar4 = false;
    }
    if (puVar2 != local_88) {
      operator_delete(puVar2);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._0_8_ != &local_68) {
      operator_delete((void *)local_78._0_8_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != paVar1) {
      operator_delete(local_b8._M_dataplus._M_p);
    }
    if (bVar4) {
      loadPLY(this,filename);
    }
    else {
      FileName::ext_abi_cxx11_(&local_b8,filename);
      toLowerCase((string *)&local_78.field_1,&local_b8);
      local_98 = local_88;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"xml","");
      puVar2 = local_98;
      if (local_78._8_8_ == local_90) {
        if (local_78._8_8_ == 0) {
          bVar4 = true;
        }
        else {
          iVar3 = bcmp((void *)local_78._0_8_,local_98,local_78._8_8_);
          bVar4 = iVar3 == 0;
        }
      }
      else {
        bVar4 = false;
      }
      if (puVar2 != local_88) {
        operator_delete(puVar2);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._0_8_ != &local_68) {
        operator_delete((void *)local_78._0_8_);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._M_dataplus._M_p != paVar1) {
        operator_delete(local_b8._M_dataplus._M_p);
      }
      if (bVar4) {
        local_78._0_8_ = 0x3f800000;
        local_78._8_8_ = 0;
        local_68._M_allocated_capacity = 0x3f80000000000000;
        local_68._8_8_ = 0;
        local_58 = 0;
        uStack_50 = 0x3f800000;
        local_48 = 0;
        uStack_40 = 0;
        loadXML(this,filename,(AffineSpace3fa *)&local_78.field_1);
      }
      else {
        FileName::ext_abi_cxx11_(&local_b8,filename);
        toLowerCase((string *)&local_78.field_1,&local_b8);
        local_98 = local_88;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"scn","");
        puVar2 = local_98;
        if (local_78._8_8_ == local_90) {
          if (local_78._8_8_ == 0) {
            bVar4 = true;
          }
          else {
            iVar3 = bcmp((void *)local_78._0_8_,local_98,local_78._8_8_);
            bVar4 = iVar3 == 0;
          }
        }
        else {
          bVar4 = false;
        }
        if (puVar2 != local_88) {
          operator_delete(puVar2);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_78._0_8_ != &local_68) {
          operator_delete((void *)local_78._0_8_);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b8._M_dataplus._M_p != paVar1) {
          operator_delete(local_b8._M_dataplus._M_p);
        }
        if (!bVar4) {
          this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
          FileName::ext_abi_cxx11_(&local_b8,filename);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &local_78.field_1,"unknown scene format: ",&local_b8);
          std::runtime_error::runtime_error(this_00,(string *)&local_78.field_1);
          __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        local_78._0_8_ = 0x3f800000;
        local_78._8_8_ = 0;
        local_68._M_allocated_capacity = 0x3f80000000000000;
        local_68._8_8_ = 0;
        local_58 = 0;
        uStack_50 = 0x3f800000;
        local_48 = 0;
        uStack_40 = 0;
        loadCorona(this,filename,(AffineSpace3fa *)&local_78.field_1);
      }
    }
  }
  return (Ref<embree::SceneGraph::Node>)(Node *)this;
}

Assistant:

Ref<SceneGraph::Node> SceneGraph::load(const FileName& filename, const bool singleObject)
  {
    if      (toLowerCase(filename.ext()) == std::string("obj" )) return loadOBJ(filename, false, singleObject);
    else if (toLowerCase(filename.ext()) == std::string("ply" )) return loadPLY(filename);
    else if (toLowerCase(filename.ext()) == std::string("xml" )) return loadXML(filename);
    else if (toLowerCase(filename.ext()) == std::string("scn" )) return loadCorona(filename);
    else throw std::runtime_error("unknown scene format: " + filename.ext());
  }